

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  long *plVar1;
  void *pvVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  void *__ptr;
  void *__ptr_00;
  Vec_Ptr_t *pVVar6;
  char *__s;
  size_t sVar7;
  char *__dest;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  Aig_Obj_t *pAVar13;
  int iVar14;
  Aig_Man_t *__ptr_01;
  
  iVar14 = pNtk->nObjCounts[8];
  lVar11 = (long)iVar14;
  __ptr = malloc(lVar11 * 8);
  __ptr_00 = malloc(lVar11 * 4);
  pVVar6 = pNtk->vBoxes;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      plVar1 = (long *)pVVar6->pArray[lVar12];
      if ((*(uint *)((long)plVar1 + 0x14) & 0xf) == 8) {
        __s = Abc_ObjName(*(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8))
        ;
        sVar7 = strlen(__s);
        __dest = (char *)malloc(sVar7 + 1);
        *(char **)((long)__ptr + lVar12 * 8) = __dest;
        strcpy(__dest,__s);
      }
      lVar12 = lVar12 + 1;
      pVVar6 = pNtk->vBoxes;
    } while (lVar12 < pVVar6->nSize);
  }
  __ptr_01 = pAig;
  Aig_ManSetCioIds(pAig);
  if (0 < pAig->nRegs) {
    lVar12 = 0;
    bVar4 = false;
    do {
      uVar10 = (ulong)(uint)pAig->nTruePis + lVar12;
      iVar8 = (int)uVar10;
      if ((iVar8 < 0) || (pAig->vCis->nSize <= iVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAig->vCis->pArray[uVar10 & 0xffffffff];
      *(undefined4 *)((long)__ptr_00 + lVar12 * 4) = 0;
      if (pAig->pReprs == (Aig_Obj_t **)0x0) {
        pAVar13 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar13 = pAig->pReprs[*(int *)((long)pvVar2 + 0x24)];
      }
      if (pAVar13 != (Aig_Obj_t *)0x0) {
        uVar3 = *(undefined8 *)((long)__ptr + lVar12 * 8);
        if (!bVar4) {
          Abc_Print((int)__ptr_01,"Here are the flop equivalences:\n");
        }
        if (((ulong)pAVar13 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                        ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
        }
        uVar5 = (uint)*(undefined8 *)&pAVar13->field_0x18;
        uVar9 = uVar5 & 7;
        if (uVar9 == 2) {
          if ((pAVar13->field_0).CioId < pAig->nTruePis) goto LAB_002aaad6;
          if (0xfffffffd < (uVar5 & 7) - 7) {
            __assert_fail("!Aig_ObjIsNode(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                          ,0x11d,"int Aig_ObjCioId(Aig_Obj_t *)");
          }
          Abc_Print((int)__ptr_01,"Original flop %s is proved equivalent to flop %s.\n",uVar3,
                    *(undefined8 *)
                     ((long)__ptr + ((long)(pAVar13->field_0).CioId - (long)pAig->nTruePis) * 8));
        }
        else {
          if (uVar9 != 1) {
LAB_002aaad6:
            __assert_fail("Saig_ObjIsLo( pAig, pRepr )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDar.c"
                          ,0x863,"void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *, Aig_Man_t *)");
          }
          Abc_Print((int)__ptr_01,"Original flop %s is proved equivalent to constant.\n",uVar3);
        }
        bVar4 = true;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pAig->nRegs);
  }
  if (0 < iVar14) {
    lVar12 = 0;
    bVar4 = false;
    do {
      iVar14 = (int)__ptr_01;
      if (*(int *)((long)__ptr_00 + lVar12 * 4) != 0) {
        if (!bVar4) {
          Abc_Print(iVar14,"The following flops have been deemed irrelevant:\n");
        }
        Abc_Print(iVar14,"%s ",*(undefined8 *)((long)__ptr + lVar12 * 8));
        bVar4 = true;
      }
      __ptr_01 = *(Aig_Man_t **)((long)__ptr + lVar12 * 8);
      if (__ptr_01 != (Aig_Man_t *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)__ptr + lVar12 * 8) = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar11 != lVar12);
    if (bVar4) {
      Abc_Print((int)__ptr_01,"\n");
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintLatchEquivClasses( Abc_Ntk_t * pNtk, Aig_Man_t * pAig )
{
    int header_dumped = 0;
    int num_orig_latches = Abc_NtkLatchNum(pNtk);
    char **pNames = ABC_ALLOC( char *, num_orig_latches );
    int *p_irrelevant = ABC_ALLOC( int, num_orig_latches );
    char * pFlopName, * pReprName;
    Aig_Obj_t * pFlop, * pRepr;
    Abc_Obj_t * pNtkFlop; 
    int repr_idx;
    int i;

    Abc_NtkForEachLatch( pNtk, pNtkFlop, i )
    {
        char *temp_name = Abc_ObjName( Abc_ObjFanout0(pNtkFlop) );
        pNames[i] = ABC_ALLOC( char , strlen(temp_name)+1);
        strcpy(pNames[i], temp_name);
    }
    i = 0;
    
    Aig_ManSetCioIds( pAig );
    Saig_ManForEachLo( pAig, pFlop, i )
    {
        p_irrelevant[i] = false;
        
        pFlopName = pNames[i];

        pRepr = Aig_ObjRepr(pAig, pFlop);

        if ( pRepr == NULL )
        {
            // Abc_Print( 1, "Nothing equivalent to flop %s\n", pFlopName);
//            p_irrelevant[i] = true;
            continue;
        }

        if (!header_dumped)
        {
            Abc_Print( 1, "Here are the flop equivalences:\n");
            header_dumped = true;
        }

        // pRepr is representative of the equivalence class, to which pFlop belongs
        if ( Aig_ObjIsConst1(pRepr) )
        {
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", pFlopName );
            // Abc_Print( 1, "Original flop # %d is proved equivalent to constant.\n", i );
            continue;
        }

        assert( Saig_ObjIsLo( pAig, pRepr ) );
        repr_idx = Aig_ObjCioId(pRepr) - Saig_ManPiNum(pAig);
        pReprName = pNames[repr_idx];
        Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",  pFlopName, pReprName );
        // Abc_Print( 1, "Original flop # %d is proved equivalent to flop # %d.\n",  i, repr_idx );
    }

    header_dumped = false;
    for (i=0; i<num_orig_latches; ++i)
    {
        if (p_irrelevant[i])
        {
            if (!header_dumped)
            {
                Abc_Print( 1, "The following flops have been deemed irrelevant:\n");
                header_dumped = true;
            }
            Abc_Print( 1, "%s ", pNames[i]);
        }
        
        ABC_FREE(pNames[i]);
    }
    if (header_dumped)
        Abc_Print( 1, "\n");
    
    ABC_FREE(pNames);
    ABC_FREE(p_irrelevant);
}